

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlibrary.cpp
# Opt level: O0

QObject * __thiscall QLibraryPrivate::pluginInstance(QLibraryPrivate *this)

{
  long lVar1;
  bool bVar2;
  anon_class_8_1_8991fb9c *in_RDI;
  long in_FS_OFFSET;
  QtPluginInstanceFunction factory;
  QObject *obj;
  QMutexLocker<QMutex> locker;
  QObject *in_stack_ffffffffffffff98;
  QMutexLocker<QMutex> *in_stack_ffffffffffffffa0;
  Type local_40;
  QObject *local_38;
  QObject *local_28;
  QLibraryPrivate *in_stack_fffffffffffffff0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = pluginInstance::anon_class_8_1_8991fb9c::operator()(in_RDI);
  if (local_28 == (QObject *)0x0) {
    local_40 = QBasicAtomicPointer<QObject_*()>::loadAcquire
                         ((QBasicAtomicPointer<QObject_*()> *)0x8c25ce);
    if (local_40 == (Type)0x0) {
      local_40 = loadPlugin(in_stack_fffffffffffffff0);
    }
    if (local_40 == (Type)0x0) {
      local_28 = (QObject *)0x0;
    }
    else {
      local_38 = (*local_40)();
      QMutexLocker<QMutex>::QMutexLocker
                (in_stack_ffffffffffffffa0,(QMutex *)in_stack_ffffffffffffff98);
      bVar2 = QPointer::operator_cast_to_bool((QPointer<QObject> *)0x8c2642);
      if (bVar2) {
        local_38 = QPointer::operator_cast_to_QObject_((QPointer<QObject> *)0x8c2656);
      }
      else {
        QPointer<QObject>::operator=
                  ((QPointer<QObject> *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      }
      local_28 = local_38;
      QMutexLocker<QMutex>::~QMutexLocker(in_stack_ffffffffffffffa0);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_28;
}

Assistant:

QObject *QLibraryPrivate::pluginInstance()
{
    // first, check if the instance is cached and hasn't been deleted
    QObject *obj = [&](){ QMutexLocker locker(&mutex); return inst.data(); }();
    if (obj)
        return obj;

    // We need to call the plugin's factory function. Is that cached?
    // skip increasing the reference count (why? -Thiago)
    QtPluginInstanceFunction factory = instanceFactory.loadAcquire();
    if (!factory)
        factory = loadPlugin();

    if (!factory)
        return nullptr;

    obj = factory();

    // cache again
    QMutexLocker locker(&mutex);
    if (inst)
        obj = inst;
    else
        inst = obj;
    return obj;
}